

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_ncode(compiler_state_t *cstate,char *s,bpf_u_int32 v,qual q)

{
  uint dir_00;
  uint uVar1;
  block *pbVar2;
  block *pbVar3;
  block *b_1;
  block *b;
  int vlen;
  int dir;
  int proto;
  bpf_u_int32 mask;
  bpf_u_int32 v_local;
  char *s_local;
  compiler_state_t *cstate_local;
  qual q_local;
  
  cstate_local._5_1_ = q.proto;
  vlen = (int)cstate_local._5_1_;
  dir_00 = (uint)q >> 0x10 & 0xff;
  proto = v;
  _mask = s;
  s_local = (char *)cstate;
  cstate_local._4_4_ = q;
  if (s == (char *)0x0) {
    b._4_1_ = '\0';
  }
  else {
    if (cstate_local._5_1_ == 0xc) {
      b._4_4_ = __pcap_atodn(s,(bpf_u_int32 *)&proto);
      if (b._4_4_ == 0) {
        bpf_error((compiler_state_t *)s_local,"malformed decnet address \'%s\'",_mask);
      }
    }
    else {
      b._4_4_ = __pcap_atoin(s,(bpf_u_int32 *)&proto);
    }
  }
  uVar1 = (uint)cstate_local._4_4_ & 0xff;
  if (uVar1 < 3) {
    if (vlen == 0xc) {
      pbVar2 = gen_host((compiler_state_t *)s_local,proto,0,0xc,dir_00,
                        (uint)cstate_local._4_4_ & 0xff);
      return pbVar2;
    }
    if (vlen != 1) {
      dir = -1;
      if ((_mask == (char *)0x0) && (cstate_local._4_1_ == '\x02')) {
        for (; proto != 0 && (proto & 0xff000000U) == 0; proto = proto << 8) {
          dir = dir << 8;
        }
      }
      else {
        proto = proto << (0x20U - b._4_1_ & 0x1f);
        dir = -1 << (0x20U - b._4_1_ & 0x1f);
      }
      pbVar2 = gen_host((compiler_state_t *)s_local,proto,dir,vlen,dir_00,
                        (uint)cstate_local._4_4_ & 0xff);
      return pbVar2;
    }
    bpf_error((compiler_state_t *)s_local,"illegal link layer address");
  }
  else if (uVar1 != 3) {
    if (uVar1 == 4) {
      bpf_error((compiler_state_t *)s_local,"\'gateway\' requires a name");
    }
    else if (uVar1 != 5) {
      if (uVar1 == 6) {
        pbVar2 = gen_protochain((compiler_state_t *)s_local,proto,vlen,dir_00);
        return pbVar2;
      }
      if (uVar1 == 7) {
        if (vlen == 7) {
          vlen = 0x11;
        }
        else if (vlen == 6) {
          vlen = 6;
        }
        else if (vlen == 5) {
          vlen = 0x84;
        }
        else if (vlen == 0) {
          vlen = -1;
        }
        else {
          bpf_error((compiler_state_t *)s_local,"illegal qualifier of \'portrange\'");
        }
        if (0xffff < (uint)proto) {
          bpf_error((compiler_state_t *)s_local,"illegal port number %u > 65535",(ulong)(uint)proto)
          ;
        }
        pbVar2 = gen_portrange((compiler_state_t *)s_local,proto,proto,vlen,dir_00);
        pbVar3 = gen_portrange6((compiler_state_t *)s_local,proto,proto,vlen,dir_00);
        gen_or(pbVar3,pbVar2);
        return pbVar2;
      }
      if (uVar1 == 0xff) {
        syntax((compiler_state_t *)s_local);
      }
      abort();
    }
    pbVar2 = gen_proto((compiler_state_t *)s_local,proto,vlen,dir_00);
    return pbVar2;
  }
  if (vlen == 7) {
    vlen = 0x11;
  }
  else if (vlen == 6) {
    vlen = 6;
  }
  else if (vlen == 5) {
    vlen = 0x84;
  }
  else if (vlen == 0) {
    vlen = -1;
  }
  else {
    bpf_error((compiler_state_t *)s_local,"illegal qualifier of \'port\'");
  }
  if (0xffff < (uint)proto) {
    bpf_error((compiler_state_t *)s_local,"illegal port number %u > 65535",(ulong)(uint)proto);
  }
  pbVar2 = gen_port((compiler_state_t *)s_local,proto,vlen,dir_00);
  pbVar3 = gen_port6((compiler_state_t *)s_local,proto,vlen,dir_00);
  gen_or(pbVar3,pbVar2);
  return pbVar2;
}

Assistant:

struct block *
gen_ncode(compiler_state_t *cstate, const char *s, bpf_u_int32 v, struct qual q)
{
	bpf_u_int32 mask;
	int proto = q.proto;
	int dir = q.dir;
	register int vlen;

	if (s == NULL)
		vlen = 32;
	else if (q.proto == Q_DECNET) {
		vlen = __pcap_atodn(s, &v);
		if (vlen == 0)
			bpf_error(cstate, "malformed decnet address '%s'", s);
	} else
		vlen = __pcap_atoin(s, &v);

	switch (q.addr) {

	case Q_DEFAULT:
	case Q_HOST:
	case Q_NET:
		if (proto == Q_DECNET)
			return gen_host(cstate, v, 0, proto, dir, q.addr);
		else if (proto == Q_LINK) {
			bpf_error(cstate, "illegal link layer address");
		} else {
			mask = 0xffffffff;
			if (s == NULL && q.addr == Q_NET) {
				/* Promote short net number */
				while (v && (v & 0xff000000) == 0) {
					v <<= 8;
					mask <<= 8;
				}
			} else {
				/* Promote short ipaddr */
				v <<= 32 - vlen;
				mask <<= 32 - vlen ;
			}
			return gen_host(cstate, v, mask, proto, dir, q.addr);
		}

	case Q_PORT:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'port'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_port(cstate, (int)v, proto, dir);
		gen_or(gen_port6(cstate, (int)v, proto, dir), b);
		return b;
	    }

	case Q_PORTRANGE:
		if (proto == Q_UDP)
			proto = IPPROTO_UDP;
		else if (proto == Q_TCP)
			proto = IPPROTO_TCP;
		else if (proto == Q_SCTP)
			proto = IPPROTO_SCTP;
		else if (proto == Q_DEFAULT)
			proto = PROTO_UNDEF;
		else
			bpf_error(cstate, "illegal qualifier of 'portrange'");

		if (v > 65535)
			bpf_error(cstate, "illegal port number %u > 65535", v);

	    {
		struct block *b;
		b = gen_portrange(cstate, (int)v, (int)v, proto, dir);
		gen_or(gen_portrange6(cstate, (int)v, (int)v, proto, dir), b);
		return b;
	    }

	case Q_GATEWAY:
		bpf_error(cstate, "'gateway' requires a name");
		/* NOTREACHED */

	case Q_PROTO:
		return gen_proto(cstate, (int)v, proto, dir);

	case Q_PROTOCHAIN:
		return gen_protochain(cstate, (int)v, proto, dir);

	case Q_UNDEF:
		syntax(cstate);
		/* NOTREACHED */

	default:
		abort();
		/* NOTREACHED */
	}
	/* NOTREACHED */
}